

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O2

void __thiscall OpenMD::ZConstraintForceModifier::zeroVelocity(ZConstraintForceModifier *this)

{
  Molecule *pMVar1;
  long lVar2;
  pointer ppSVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  pointer ppMVar6;
  StuntDouble *pSVar7;
  undefined8 *puVar8;
  RealType RVar9;
  Vector3d vel;
  Vector3d comVel;
  double local_90;
  Vector<double,_3U> local_80;
  Vector<double,_3U> local_68;
  _List_node_base *local_50;
  Vector<double,_3U> local_48;
  
  Vector<double,_3U>::Vector(&local_68);
  Vector<double,_3U>::Vector(&local_80);
  p_Var5 = (_List_node_base *)&this->fixedZMols_;
  while (p_Var5 = (((_List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                   &p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var5 != (_List_node_base *)&this->fixedZMols_) {
    pMVar1 = (Molecule *)p_Var5[1]._M_next;
    Molecule::getComVel((Vector3d *)&local_48,pMVar1);
    Vector<double,_3U>::operator=(&local_68,&local_48);
    ppSVar3 = (pMVar1->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar3 !=
        (pMVar1->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001e060b;
    pSVar7 = (StuntDouble *)0x0;
    while (pSVar7 != (StuntDouble *)0x0) {
      StuntDouble::getVel((Vector3d *)&local_48,pSVar7);
      Vector<double,_3U>::operator=(&local_80,&local_48);
      local_80.data_[2] = local_80.data_[2] - local_68.data_[2];
      StuntDouble::setVel(pSVar7,(Vector3d *)&local_80);
      ppSVar3 = ppSVar3 + 1;
      pSVar7 = (StuntDouble *)0x0;
      if (ppSVar3 !=
          (pMVar1->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_001e060b:
        pSVar7 = *ppSVar3;
      }
    }
  }
  p_Var5 = (_List_node_base *)&this->movingZMols_;
  local_90 = 0.0;
  p_Var4 = p_Var5;
  while (p_Var4 = (((_List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                   &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != p_Var5) {
    pMVar1 = (Molecule *)p_Var4[1]._M_next;
    Molecule::getComVel((Vector3d *)&local_48,pMVar1);
    Vector<double,_3U>::operator=(&local_68,&local_48);
    RVar9 = Molecule::getMass(pMVar1);
    local_90 = local_90 + RVar9 * local_68.data_[2];
  }
  for (ppMVar6 = (this->unzconsMols_).
                 super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      ppMVar6 !=
      (this->unzconsMols_).
      super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppMVar6 = ppMVar6 + 1) {
    pMVar1 = *ppMVar6;
    Molecule::getComVel((Vector3d *)&local_48,pMVar1);
    Vector<double,_3U>::operator=(&local_68,&local_48);
    RVar9 = Molecule::getMass(pMVar1);
    local_90 = local_90 + RVar9 * local_68.data_[2];
  }
  local_90 = local_90 / (this->totMassMovingZMols_ + this->totMassUnconsMols_);
  local_50 = p_Var5;
  while (p_Var5 = (((_List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                   &p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var5 != local_50) {
    lVar2 = (long)p_Var5[1]._M_next;
    puVar8 = *(undefined8 **)(lVar2 + 0xa0);
    if (puVar8 != *(undefined8 **)(lVar2 + 0xa8)) goto LAB_001e076e;
    pSVar7 = (StuntDouble *)0x0;
    while (pSVar7 != (StuntDouble *)0x0) {
      StuntDouble::getVel((Vector3d *)&local_48,pSVar7);
      Vector<double,_3U>::operator=(&local_80,&local_48);
      local_80.data_[2] = local_80.data_[2] - local_90;
      StuntDouble::setVel(pSVar7,(Vector3d *)&local_80);
      puVar8 = puVar8 + 1;
      pSVar7 = (StuntDouble *)0x0;
      if (puVar8 != *(undefined8 **)(lVar2 + 0xa8)) {
LAB_001e076e:
        pSVar7 = (StuntDouble *)*puVar8;
      }
    }
  }
  for (ppMVar6 = (this->unzconsMols_).
                 super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      ppMVar6 !=
      (this->unzconsMols_).
      super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppMVar6 = ppMVar6 + 1) {
    pMVar1 = *ppMVar6;
    ppSVar3 = (pMVar1->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar3 !=
        (pMVar1->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001e07fa;
    pSVar7 = (StuntDouble *)0x0;
    while (pSVar7 != (StuntDouble *)0x0) {
      StuntDouble::getVel((Vector3d *)&local_48,pSVar7);
      Vector<double,_3U>::operator=(&local_80,&local_48);
      local_80.data_[2] = local_80.data_[2] - local_90;
      StuntDouble::setVel(pSVar7,(Vector3d *)&local_80);
      ppSVar3 = ppSVar3 + 1;
      pSVar7 = (StuntDouble *)0x0;
      if (ppSVar3 !=
          (pMVar1->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_001e07fa:
        pSVar7 = *ppSVar3;
      }
    }
  }
  return;
}

Assistant:

void ZConstraintForceModifier::zeroVelocity() {
    Vector3d comVel;
    Vector3d vel;
    std::list<ZconstraintMol>::iterator i;
    Molecule* mol;
    StuntDouble* sd;
    Molecule::IntegrableObjectIterator ii;

    // Zero out the velocities of center of mass of fixed
    // z-constrained molecules
    for (i = fixedZMols_.begin(); i != fixedZMols_.end(); ++i) {
      mol    = i->mol;
      comVel = mol->getComVel();

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        vel = sd->getVel();
        vel[whichDirection] -= comVel[whichDirection];
        sd->setVel(vel);
      }
    }

    // Calculate the vz of center of mass of moving molecules
    // (including unconstrained molecules and moving z-constrained
    // molecules)

    RealType pzMovingMols = 0.0;

    for (i = movingZMols_.begin(); i != movingZMols_.end(); ++i) {
      mol    = i->mol;
      comVel = mol->getComVel();
      pzMovingMols += mol->getMass() * comVel[whichDirection];
    }

    std::vector<Molecule*>::iterator j;
    for (j = unzconsMols_.begin(); j != unzconsMols_.end(); ++j) {
      mol    = *j;
      comVel = mol->getComVel();
      pzMovingMols += mol->getMass() * comVel[whichDirection];
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &pzMovingMols, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    RealType vzMovingMols =
        pzMovingMols / (totMassMovingZMols_ + totMassUnconsMols_);

    // Modify the velocities of moving z-constrained molecules

    for (i = movingZMols_.begin(); i != movingZMols_.end(); ++i) {
      mol = i->mol;

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        vel = sd->getVel();
        vel[whichDirection] -= vzMovingMols;
        sd->setVel(vel);
      }
    }

    // Modify the velocites of unconstrained molecules
    for (j = unzconsMols_.begin(); j != unzconsMols_.end(); ++j) {
      mol = *j;

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        vel = sd->getVel();
        vel[whichDirection] -= vzMovingMols;
        sd->setVel(vel);
      }
    }
  }